

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testRgba.cpp
# Opt level: O1

void anon_unknown.dwarf_2c557e::writeReadRGBA
               (char *fileName,int width,int height,Array2D<Imf_3_2::Rgba> *p1,RgbaChannels channels
               ,LineOrder lorder,Compression comp)

{
  long lVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  ostream *this;
  long *plVar6;
  int *piVar7;
  RgbaChannels *pRVar8;
  long lVar9;
  undefined8 *puVar10;
  undefined8 *puVar11;
  float *pfVar12;
  undefined4 uVar13;
  long lVar14;
  half *phVar15;
  long lVar16;
  uint uVar17;
  undefined4 in_register_00000034;
  Array2D<Imf_3_2::Rgba> *src;
  char *pcVar18;
  half *phVar19;
  ulong uVar20;
  ulong uVar21;
  uint uVar22;
  long lVar23;
  float fVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  int iVar29;
  int iVar30;
  int iVar31;
  Array2D<Imf_3_2::Rgba> p2;
  RgbaOutputFile out;
  Header header;
  Array2D<Imf_3_2::Rgba> local_f8;
  Rgba local_e0 [8];
  float local_a0;
  float local_9c;
  long local_98;
  long local_90;
  long local_88;
  long local_80;
  ulong local_78;
  long local_70;
  Header local_68 [56];
  
  src = (Array2D<Imf_3_2::Rgba> *)CONCAT44(in_register_00000034,width);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"channels ",9);
  uVar17 = height & 1;
  pcVar18 = "R";
  if (uVar17 == 0) {
    pcVar18 = "";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar18,(ulong)uVar17);
  uVar3 = height & 2;
  pcVar18 = "G";
  if (uVar3 == 0) {
    pcVar18 = "";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,pcVar18,(ulong)(uVar3 >> 1));
  uVar4 = height & 4;
  pcVar18 = "B";
  if (uVar4 == 0) {
    pcVar18 = "";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,pcVar18,(ulong)(uVar4 >> 2));
  uVar22 = height & 8;
  pcVar18 = "A";
  if (uVar22 == 0) {
    pcVar18 = "";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,pcVar18,(ulong)(uVar22 >> 3));
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", line order ",0xd);
  this = (ostream *)std::ostream::operator<<(&std::cout,(int)p1);
  std::__ostream_insert<char,std::char_traits<char>>(this,", compression ",0xe);
  plVar6 = (long *)std::ostream::operator<<(this,channels);
  std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
  std::ostream::put((char)plVar6);
  std::ostream::flush();
  local_e0[0].r._h = 0;
  local_e0[0].g._h = 0;
  local_e0[0].b._h = 0;
  local_e0[0].a._h = 0;
  Imf_3_2::Header::Header(local_68,0xed,0x77,1.0,(Vec2 *)local_e0,1.0,INCREASING_Y,ZIP_COMPRESSION);
  piVar7 = (int *)Imf_3_2::Header::lineOrder();
  *piVar7 = (int)p1;
  pRVar8 = (RgbaChannels *)Imf_3_2::Header::compression();
  *pRVar8 = channels;
  remove(fileName);
  iVar5 = Imf_3_2::globalThreadCount();
  Imf_3_2::RgbaOutputFile::RgbaOutputFile((RgbaOutputFile *)local_e0,fileName,local_68,height,iVar5)
  ;
  local_78 = (ulong)uVar17;
  Imf_3_2::RgbaOutputFile::setFrameBuffer(local_e0,(ulong)src->_data,1);
  iVar5 = 0x77;
  do {
    fVar24 = (float)Imath_3_2::Rand32::nextf();
    Imf_3_2::RgbaOutputFile::writePixels((int)local_e0);
    iVar5 = iVar5 - (int)(fVar24 * (float)iVar5 + 0.5);
  } while (iVar5 != 0);
  Imf_3_2::RgbaOutputFile::~RgbaOutputFile((RgbaOutputFile *)local_e0);
  iVar5 = Imf_3_2::globalThreadCount();
  Imf_3_2::RgbaInputFile::RgbaInputFile((RgbaInputFile *)local_e0,fileName,iVar5);
  piVar7 = (int *)Imf_3_2::RgbaInputFile::dataWindow();
  uVar2 = local_78;
  iVar5 = piVar7[2];
  lVar23 = (long)*piVar7;
  local_70 = iVar5 - lVar23;
  lVar1 = local_70 + 1;
  local_88 = (long)piVar7[3];
  lVar16 = (long)piVar7[1];
  local_80 = local_88 - lVar16;
  lVar9 = local_80 + 1;
  local_f8._sizeX = lVar9;
  local_f8._sizeY = lVar1;
  local_f8._data =
       (Rgba *)operator_new__(-(ulong)((ulong)(lVar9 * lVar1) >> 0x3d != 0) | lVar9 * lVar1 * 8);
  lVar14 = lVar1;
  local_98 = lVar16;
  local_90 = lVar23;
  Imf_3_2::RgbaInputFile::setFrameBuffer
            (local_e0,(ulong)(local_f8._data + (-lVar16 * lVar1 - lVar23)),1);
  uVar13 = (undefined4)lVar14;
  Imf_3_2::RgbaInputFile::readPixels((int)local_e0,piVar7[1]);
  puVar10 = (undefined8 *)Imf_3_2::RgbaInputFile::displayWindow();
  puVar11 = (undefined8 *)Imf_3_2::Header::displayWindow();
  iVar29 = -(uint)((int)*puVar11 == (int)*puVar10);
  iVar30 = -(uint)((int)((ulong)*puVar11 >> 0x20) == (int)((ulong)*puVar10 >> 0x20));
  auVar25._4_4_ = iVar29;
  auVar25._0_4_ = iVar29;
  auVar25._8_4_ = iVar30;
  auVar25._12_4_ = iVar30;
  iVar29 = movmskpd(uVar13,auVar25);
  if ((iVar29 != 3) ||
     (iVar30 = -(uint)((int)puVar11[1] == (int)puVar10[1]),
     iVar31 = -(uint)((int)((ulong)puVar11[1] >> 0x20) == (int)((ulong)puVar10[1] >> 0x20)),
     auVar26._4_4_ = iVar30, auVar26._0_4_ = iVar30, auVar26._8_4_ = iVar31, auVar26._12_4_ = iVar31
     , iVar30 = movmskpd((int)puVar11,auVar26), iVar30 != 3)) {
    __assert_fail("in.displayWindow () == header.displayWindow ()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testRgbaThreading.cpp"
                  ,0x6b,
                  "void (anonymous namespace)::writeReadRGBA(const char *, int, int, const Array2D<Rgba> &, RgbaChannels, LineOrder, Compression)"
                 );
  }
  puVar10 = (undefined8 *)Imf_3_2::RgbaInputFile::dataWindow();
  puVar11 = (undefined8 *)Imf_3_2::Header::dataWindow();
  iVar30 = -(uint)((int)*puVar11 == (int)*puVar10);
  iVar31 = -(uint)((int)((ulong)*puVar11 >> 0x20) == (int)((ulong)*puVar10 >> 0x20));
  auVar27._4_4_ = iVar30;
  auVar27._0_4_ = iVar30;
  auVar27._8_4_ = iVar31;
  auVar27._12_4_ = iVar31;
  iVar29 = movmskpd(iVar29,auVar27);
  if ((iVar29 != 3) ||
     (iVar29 = -(uint)((int)puVar11[1] == (int)puVar10[1]),
     iVar30 = -(uint)((int)((ulong)puVar11[1] >> 0x20) == (int)((ulong)puVar10[1] >> 0x20)),
     auVar28._4_4_ = iVar29, auVar28._0_4_ = iVar29, auVar28._8_4_ = iVar30, auVar28._12_4_ = iVar30
     , iVar29 = movmskpd((int)puVar11,auVar28), iVar29 != 3)) {
    __assert_fail("in.dataWindow () == header.dataWindow ()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testRgbaThreading.cpp"
                  ,0x6c,
                  "void (anonymous namespace)::writeReadRGBA(const char *, int, int, const Array2D<Rgba> &, RgbaChannels, LineOrder, Compression)"
                 );
  }
  fVar24 = (float)Imf_3_2::RgbaInputFile::pixelAspectRatio();
  pfVar12 = (float *)Imf_3_2::Header::pixelAspectRatio();
  if ((fVar24 == *pfVar12) && (!NAN(fVar24) && !NAN(*pfVar12))) {
    Imf_3_2::RgbaInputFile::screenWindowCenter();
    pfVar12 = (float *)Imf_3_2::Header::screenWindowCenter();
    if ((((local_a0 != *pfVar12) || (NAN(local_a0) || NAN(*pfVar12))) || (local_9c != pfVar12[1]))
       || (NAN(local_9c) || NAN(pfVar12[1]))) {
      __assert_fail("in.screenWindowCenter () == header.screenWindowCenter ()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testRgbaThreading.cpp"
                    ,0x6e,
                    "void (anonymous namespace)::writeReadRGBA(const char *, int, int, const Array2D<Rgba> &, RgbaChannels, LineOrder, Compression)"
                   );
    }
    fVar24 = (float)Imf_3_2::RgbaInputFile::screenWindowWidth();
    pfVar12 = (float *)Imf_3_2::Header::screenWindowWidth();
    if ((fVar24 != *pfVar12) || (NAN(fVar24) || NAN(*pfVar12))) {
      __assert_fail("in.screenWindowWidth () == header.screenWindowWidth ()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testRgbaThreading.cpp"
                    ,0x6f,
                    "void (anonymous namespace)::writeReadRGBA(const char *, int, int, const Array2D<Rgba> &, RgbaChannels, LineOrder, Compression)"
                   );
    }
    iVar29 = Imf_3_2::RgbaInputFile::lineOrder();
    piVar7 = (int *)Imf_3_2::Header::lineOrder();
    if (iVar29 != *piVar7) {
      __assert_fail("in.lineOrder () == header.lineOrder ()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testRgbaThreading.cpp"
                    ,0x70,
                    "void (anonymous namespace)::writeReadRGBA(const char *, int, int, const Array2D<Rgba> &, RgbaChannels, LineOrder, Compression)"
                   );
    }
    iVar29 = Imf_3_2::RgbaInputFile::compression();
    piVar7 = (int *)Imf_3_2::Header::compression();
    if (iVar29 == *piVar7) {
      iVar29 = Imf_3_2::RgbaInputFile::channels();
      if (iVar29 != height) {
        __assert_fail("in.channels () == channels",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testRgbaThreading.cpp"
                      ,0x72,
                      "void (anonymous namespace)::writeReadRGBA(const char *, int, int, const Array2D<Rgba> &, RgbaChannels, LineOrder, Compression)"
                     );
      }
      iVar29 = Imf_3_2::RgbaInputFile::compression();
      if ((iVar29 == 6) || (iVar29 = Imf_3_2::RgbaInputFile::compression(), iVar29 == 7)) {
        compareB44((int)lVar1,(int)lVar9,src,&local_f8,height);
      }
      else {
        iVar29 = Imf_3_2::RgbaInputFile::compression();
        if ((iVar29 == 8) || (iVar29 = Imf_3_2::RgbaInputFile::compression(), iVar29 == 9)) {
          compareDwa((int)lVar1,(int)lVar9,src,&local_f8,height);
        }
        else if (-1 < (int)local_80) {
          phVar15 = &(local_f8._data)->a;
          phVar19 = &src->_data->a;
          uVar20 = 0;
          do {
            if (-1 < (int)local_70) {
              uVar21 = 0;
              do {
                if ((int)uVar2 == 0) {
                  fVar24 = *(float *)(_imath_half_to_float_table +
                                     (ulong)phVar15[uVar21 * 4 + -3]._h * 4);
                  if ((fVar24 != 0.0) || (NAN(fVar24))) {
                    __assert_fail("p2[y][x].r == 0",
                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testRgbaThreading.cpp"
                                  ,0x88,
                                  "void (anonymous namespace)::writeReadRGBA(const char *, int, int, const Array2D<Rgba> &, RgbaChannels, LineOrder, Compression)"
                                 );
                  }
                }
                else {
                  fVar24 = *(float *)(_imath_half_to_float_table +
                                     (ulong)phVar15[uVar21 * 4 + -3]._h * 4);
                  pfVar12 = (float *)(_imath_half_to_float_table +
                                     (ulong)phVar19[uVar21 * 4 + -3]._h * 4);
                  if ((fVar24 != *pfVar12) || (NAN(fVar24) || NAN(*pfVar12))) {
                    __assert_fail("p2[y][x].r == p1[y][x].r",
                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testRgbaThreading.cpp"
                                  ,0x86,
                                  "void (anonymous namespace)::writeReadRGBA(const char *, int, int, const Array2D<Rgba> &, RgbaChannels, LineOrder, Compression)"
                                 );
                  }
                }
                if (uVar3 == 0) {
                  fVar24 = *(float *)(_imath_half_to_float_table +
                                     (ulong)phVar15[uVar21 * 4 + -2]._h * 4);
                  if ((fVar24 != 0.0) || (NAN(fVar24))) {
                    __assert_fail("p2[y][x].g == 0",
                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testRgbaThreading.cpp"
                                  ,0x8d,
                                  "void (anonymous namespace)::writeReadRGBA(const char *, int, int, const Array2D<Rgba> &, RgbaChannels, LineOrder, Compression)"
                                 );
                  }
                }
                else {
                  fVar24 = *(float *)(_imath_half_to_float_table +
                                     (ulong)phVar15[uVar21 * 4 + -2]._h * 4);
                  pfVar12 = (float *)(_imath_half_to_float_table +
                                     (ulong)phVar19[uVar21 * 4 + -2]._h * 4);
                  if ((fVar24 != *pfVar12) || (NAN(fVar24) || NAN(*pfVar12))) {
                    __assert_fail("p2[y][x].g == p1[y][x].g",
                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testRgbaThreading.cpp"
                                  ,0x8b,
                                  "void (anonymous namespace)::writeReadRGBA(const char *, int, int, const Array2D<Rgba> &, RgbaChannels, LineOrder, Compression)"
                                 );
                  }
                }
                if (uVar4 == 0) {
                  fVar24 = *(float *)(_imath_half_to_float_table +
                                     (ulong)phVar15[uVar21 * 4 + -1]._h * 4);
                  if ((fVar24 != 0.0) || (NAN(fVar24))) {
                    __assert_fail("p2[y][x].b == 0",
                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testRgbaThreading.cpp"
                                  ,0x92,
                                  "void (anonymous namespace)::writeReadRGBA(const char *, int, int, const Array2D<Rgba> &, RgbaChannels, LineOrder, Compression)"
                                 );
                  }
                }
                else {
                  fVar24 = *(float *)(_imath_half_to_float_table +
                                     (ulong)phVar15[uVar21 * 4 + -1]._h * 4);
                  pfVar12 = (float *)(_imath_half_to_float_table +
                                     (ulong)phVar19[uVar21 * 4 + -1]._h * 4);
                  if ((fVar24 != *pfVar12) || (NAN(fVar24) || NAN(*pfVar12))) {
                    __assert_fail("p2[y][x].b == p1[y][x].b",
                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testRgbaThreading.cpp"
                                  ,0x90,
                                  "void (anonymous namespace)::writeReadRGBA(const char *, int, int, const Array2D<Rgba> &, RgbaChannels, LineOrder, Compression)"
                                 );
                  }
                }
                if (uVar22 == 0) {
                  fVar24 = *(float *)(_imath_half_to_float_table + (ulong)phVar15[uVar21 * 4]._h * 4
                                     );
                  if ((fVar24 != 1.0) || (NAN(fVar24))) {
                    __assert_fail("p2[y][x].a == 1",
                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testRgbaThreading.cpp"
                                  ,0x97,
                                  "void (anonymous namespace)::writeReadRGBA(const char *, int, int, const Array2D<Rgba> &, RgbaChannels, LineOrder, Compression)"
                                 );
                  }
                }
                else {
                  fVar24 = *(float *)(_imath_half_to_float_table + (ulong)phVar15[uVar21 * 4]._h * 4
                                     );
                  pfVar12 = (float *)(_imath_half_to_float_table + (ulong)phVar19[uVar21 * 4]._h * 4
                                     );
                  if ((fVar24 != *pfVar12) || (NAN(fVar24) || NAN(*pfVar12))) {
                    __assert_fail("p2[y][x].a == p1[y][x].a",
                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testRgbaThreading.cpp"
                                  ,0x95,
                                  "void (anonymous namespace)::writeReadRGBA(const char *, int, int, const Array2D<Rgba> &, RgbaChannels, LineOrder, Compression)"
                                 );
                  }
                }
                uVar21 = uVar21 + 1;
              } while ((iVar5 - (int)local_90) + 1 != uVar21);
            }
            uVar20 = uVar20 + 1;
            phVar15 = phVar15 + local_f8._sizeY * 4;
            phVar19 = phVar19 + src->_sizeY * 4;
          } while (uVar20 != ((int)local_88 - (int)local_98) + 1);
        }
      }
      if (local_f8._data != (Rgba *)0x0) {
        operator_delete__(local_f8._data);
      }
      Imf_3_2::RgbaInputFile::~RgbaInputFile((RgbaInputFile *)local_e0);
      remove(fileName);
      Imf_3_2::Header::~Header(local_68);
      return;
    }
    __assert_fail("in.compression () == header.compression ()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testRgbaThreading.cpp"
                  ,0x71,
                  "void (anonymous namespace)::writeReadRGBA(const char *, int, int, const Array2D<Rgba> &, RgbaChannels, LineOrder, Compression)"
                 );
  }
  __assert_fail("in.pixelAspectRatio () == header.pixelAspectRatio ()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testRgbaThreading.cpp"
                ,0x6d,
                "void (anonymous namespace)::writeReadRGBA(const char *, int, int, const Array2D<Rgba> &, RgbaChannels, LineOrder, Compression)"
               );
}

Assistant:

void
writeReadRGBA (
    const char           fileName[],
    int                  width,
    int                  height,
    const Array2D<Rgba>& p1,
    RgbaChannels         channels,
    LineOrder            lorder,
    Compression          comp)
{
    //
    // Save the selected channels of RGBA image p1; save the
    // scan lines in the specified order.  Read the image back
    // from the file, and compare the data with the original.
    //

    cout << "channels " << ((channels & WRITE_R) ? "R" : "")
         << ((channels & WRITE_G) ? "G" : "")
         << ((channels & WRITE_B) ? "B" : "")
         << ((channels & WRITE_A) ? "A" : "") << ", line order " << lorder
         << ", compression " << comp << endl;

    Header header (width, height);
    header.lineOrder ()   = lorder;
    header.compression () = comp;

    cout << "writing ";
    cout.flush ();

    {
        remove (fileName);
        RgbaOutputFile out (fileName, header, channels);
        out.setFrameBuffer (&p1[0][0], 1, width);
        out.writePixels (height);
    }

    cout << "reading ";
    cout.flush ();

    {
        RgbaInputFile in (fileName);
        const Box2i&  dw = in.dataWindow ();

        int w  = dw.max.x - dw.min.x + 1;
        int h  = dw.max.y - dw.min.y + 1;
        int dx = dw.min.x;
        int dy = dw.min.y;

        Array2D<Rgba> p2 (h, w);
        in.setFrameBuffer (&p2[-dy][-dx], 1, w);
        in.readPixels (dw.min.y, dw.max.y);

        assert (in.displayWindow () == header.displayWindow ());
        assert (in.dataWindow () == header.dataWindow ());
        assert (in.pixelAspectRatio () == header.pixelAspectRatio ());
        assert (in.screenWindowCenter () == header.screenWindowCenter ());
        assert (in.screenWindowWidth () == header.screenWindowWidth ());
        assert (in.lineOrder () == header.lineOrder ());
        assert (in.compression () == header.compression ());
        assert (in.channels () == channels);

        if (in.compression () == B44_COMPRESSION ||
            in.compression () == B44A_COMPRESSION)
        {
            compareB44 (width, height, p1, p2, channels);
        }
        else if (
            in.compression () == DWAA_COMPRESSION ||
            in.compression () == DWAB_COMPRESSION)
        {
            compareDwa (width, height, p1, p2, channels);
        }
        else
        {
            for (int y = 0; y < h; ++y)
            {
                for (int x = 0; x < w; ++x)
                {
                    if (channels & WRITE_R)
                        assert (p2[y][x].r == p1[y][x].r);
                    else
                        assert (p2[y][x].r == 0);

                    if (channels & WRITE_G)
                        assert (p2[y][x].g == p1[y][x].g);
                    else
                        assert (p2[y][x].g == 0);

                    if (channels & WRITE_B)
                        assert (p2[y][x].b == p1[y][x].b);
                    else
                        assert (p2[y][x].b == 0);

                    if (channels & WRITE_A)
                        assert (p2[y][x].a == p1[y][x].a);
                    else
                        assert (p2[y][x].a == 1);
                }
            }
        }
    }

    remove (fileName);
}